

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_prefixes.c
# Opt level: O0

void PrefAdSize(PDISASM pMyDisasm)

{
  int iVar1;
  PDISASM pMyDisasm_local;
  
  iVar1 = Security(2,pMyDisasm);
  if (iVar1 != 0) {
    (pMyDisasm->Prefix).AddressSize = '\x01';
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
    ResetREX(pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
    (pMyDisasm->Prefix).Number = (pMyDisasm->Prefix).Number + 1;
    (pMyDisasm->Reserved_).NB_PREFIX = (pMyDisasm->Reserved_).NB_PREFIX + 1;
    if ((pMyDisasm->Reserved_).Architecture == 0x10) {
      (pMyDisasm->Reserved_).AddressSize = (pMyDisasm->Reserved_).AddressSize << 1;
    }
    else {
      (pMyDisasm->Reserved_).AddressSize = (pMyDisasm->Reserved_).AddressSize >> 1;
    }
    (pMyDisasm->Instruction).Opcode = (uint)*(byte *)(pMyDisasm->Reserved_).EIP_;
    (*opcode_map1[*(byte *)(pMyDisasm->Reserved_).EIP_])(pMyDisasm);
    if ((pMyDisasm->Reserved_).Architecture == 0x10) {
      (pMyDisasm->Reserved_).AddressSize = (pMyDisasm->Reserved_).AddressSize >> 1;
    }
    else {
      (pMyDisasm->Reserved_).AddressSize = (pMyDisasm->Reserved_).AddressSize << 1;
    }
  }
  return;
}

Assistant:

void __bea_callspec__ PrefAdSize(PDISASM pMyDisasm)
{
    if (!Security(2, pMyDisasm)) return;
    pMyDisasm->Prefix.AddressSize = InUsePrefix;
    if (GV.VEX.state == InUsePrefix) GV.ERROR_OPCODE = UD_;
    ResetREX(pMyDisasm);
    GV.EIP_++;
    pMyDisasm->Prefix.Number++;
    GV.NB_PREFIX++;
    if (GV.Architecture == 16) {
        GV.AddressSize = GV.AddressSize << 1;
    }
    else {
        GV.AddressSize = GV.AddressSize >> 1;
    }

    pMyDisasm->Instruction.Opcode = *((UInt8*) GV.EIP_);
    (void) opcode_map1[*((UInt8*) GV.EIP_)](pMyDisasm);
    if (GV.Architecture == 16) {
        GV.AddressSize = GV.AddressSize >> 1;
    }
    else {
        GV.AddressSize = GV.AddressSize << 1;
    }

}